

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdcolmap.c
# Opt level: O1

int pbm_getc(FILE *infile)

{
  int iVar1;
  
  iVar1 = getc((FILE *)infile);
  if (iVar1 == 0x23) {
    do {
      iVar1 = getc((FILE *)infile);
      if (iVar1 == 10) {
        return 10;
      }
    } while (iVar1 != -1);
  }
  return iVar1;
}

Assistant:

LOCAL(int)
pbm_getc(FILE *infile)
/* Read next char, skipping over any comments */
/* A comment/newline sequence is returned as a newline */
{
  register int ch;

  ch = getc(infile);
  if (ch == '#') {
    do {
      ch = getc(infile);
    } while (ch != '\n' && ch != EOF);
  }
  return ch;
}